

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareRootUnscentedKalmanFilter.cpp
# Opt level: O1

void __thiscall
SquareRootUnscentedKalmanFilter_updateStateCovariance_Test::TestBody
          (SquareRootUnscentedKalmanFilter_updateStateCovariance_Test *this)

{
  bool *pbVar1;
  T *this_00;
  bool bVar2;
  bool bVar3;
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *pCVar4;
  CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *pCVar5;
  ulong uVar6;
  char *pcVar7;
  char *in_R9;
  long lVar8;
  ActualDstType actualDst;
  float *pfVar9;
  undefined1 local_214 [8];
  SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_> ukf;
  Matrix<T,_2,_2> Ssquared;
  Cholesky<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1> S_y;
  Scalar *local_f8;
  undefined1 local_f0 [8];
  Matrix<T,_3,_3> P;
  float fStack_b8;
  float fStack_b4;
  Matrix<T,_3,_3> P_ref;
  float local_8c;
  Matrix<T,_3,_2> K;
  AssertionResult gtest_ar__1;
  undefined8 uStack_60;
  float local_58;
  undefined8 local_48;
  float local_40;
  float local_3c;
  AssertHelper local_38;
  
  Kalman::SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_>::
  SquareRootUnscentedKalmanFilter
            ((SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_> *)local_214,1.0,2.0,1.0);
  pbVar1 = &ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
            super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
            super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized;
  P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       1.4013e-45;
  P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       1.4013e-45;
  P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized = false;
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>._41_3_ = 0x3f8000;
  _fStack_b8 = CONCAT44(fStack_b4,0x3dcccccd);
  local_f0 = (undefined1  [8])pbVar1;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)local_f0,&fStack_b8)
  ;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] = 0.1;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_
                     (pCVar4,K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage
                             .m_data.array + 4);
  Ssquared.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2] =
       0.5;
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_
            (pCVar4,Ssquared.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.
                    m_data.array + 2);
  if ((P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._16_8_ +
       P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._0_8_ !=
       2) || (P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array.
              _8_8_ != 2)) {
    pcVar7 = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 2, 2>>::finished() [MatrixType = Eigen::Matrix<float, 2, 2>]"
    ;
LAB_001330b1:
    __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                  ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,pcVar7);
  }
  S_y.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3]._0_1_ = '\0'
  ;
  P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.1;
  P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._8_8_ =
       pbVar1;
  Eigen::LLT<Eigen::Matrix<float,2,2,0,2,2>,1>::
  compute<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,2,2,0,2,2>const>const,Eigen::Matrix<float,2,2,0,2,2>const>>
            ((LLT<Eigen::Matrix<float,2,2,0,2,2>,1> *)
             (Ssquared.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.
              array + 2),
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_2,_2,_0,_2,_2>_>,_const_Eigen::Matrix<float,_2,_2,_0,_2,_2>_>_>
              *)local_f0);
  if (S_y.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>.m_matrix.
      super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3]._0_1_ ==
      '\0') {
    __assert_fail("m_isInitialized && \"LLT is not initialized.\"",
                  "/usr/include/eigen3/Eigen/src/Cholesky/LLT.h",0xc1,
                  "ComputationInfo Eigen::LLT<Eigen::Matrix<float, 2, 2>>::info() const [MatrixType = Eigen::Matrix<float, 2, 2>, UpLo = 1]"
                 );
  }
  _fStack_b8 = CONCAT71(stack0xffffffffffffff49,
                        S_y.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>.m_l1_norm == 0.0);
  P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  if (S_y.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>.m_l1_norm == 0.0) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&P_ref,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pfVar9 = P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array + 8;
    P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
         1.4013e-45;
    P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
    P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
         1.4013e-45;
    P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
    P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
         0.17840852;
    local_f8 = &fStack_b8;
    _fStack_b8 = CONCAT44(fStack_b4,0xbe9bb3b5);
    local_f0 = (undefined1  [8])pfVar9;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)local_f0,local_f8)
    ;
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
         -1.1109985;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                       (pCVar5,K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                               m_storage.m_data.array + 4);
    local_48._0_4_ = 0.8028383;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                       (pCVar5,(Scalar *)&local_48);
    local_38.data_._0_4_ = 0xbf9f820e;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                       (pCVar5,(Scalar *)&local_38);
    S_y.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>._28_4_ = 0x3d821900;
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
              (pCVar5,(Scalar *)&S_y.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>.field_0x1c);
    if ((P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._16_8_
         + P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array.
           _0_8_ != 3) ||
       (P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._8_8_
        != 2)) {
      pcVar7 = 
      "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 3, 2>>::finished() [MatrixType = Eigen::Matrix<float, 3, 2>]"
      ;
      goto LAB_001330b1;
    }
    this_00 = &ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma;
    ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma = 1.0;
    ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.lambda = 0.0;
    ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
    super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
    super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
    super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
    super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
    super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
    super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 1.0;
    ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
    super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
    super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
    ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
    super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
    super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
    ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
    super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
    super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
    ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
    super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
    super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 1.0;
    ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
    super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
    super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]._0_1_ = 1;
    Eigen::LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::reconstructedMatrix
              ((MatrixType *)
               (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
               + 4),(LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)this_00);
    Eigen::LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>::reconstructedMatrix
              ((LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1> *)&local_48);
    local_f0._0_4_ =
         K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[1] *
         local_48._4_4_ +
         P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
         * (float)local_48;
    local_f0._4_4_ =
         local_48._4_4_ *
         K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[2] +
         (float)local_48 * local_8c;
    P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
         local_48._4_4_ *
         K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[3] +
         (float)local_48 *
         K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[0];
    P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
         K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[1] *
         local_3c +
         P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
         * local_40;
    P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
         K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[2] *
         local_3c + local_8c * local_40;
    P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
         K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[3] *
         local_3c +
         K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[0] *
         local_40;
    fStack_b8 = K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
                [4];
    fStack_b4 = K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
                [5];
    _fStack_b8 = CONCAT44(fStack_b4 -
                          (P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data.array[2] *
                           K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.
                           m_data.array[1] +
                          (float)local_f0._4_4_ *
                          P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[8]),
                          fStack_b8 -
                          (P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data.array[1] *
                           K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.
                           m_data.array[1] +
                          (float)local_f0._0_4_ *
                          P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[8]));
    P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
         gtest_ar__1._0_4_;
    P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
         gtest_ar__1._4_4_;
    P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
         P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
         - (P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
            * K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
              [2] + (float)local_f0._0_4_ * local_8c);
    P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
         P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         - (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[1]
            * P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
              [3] + P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                    m_data.array[8] *
                    P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[0]);
    P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
         SUB84(gtest_ar__1.message_.ptr_,0);
    P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
         (float)((ulong)gtest_ar__1.message_.ptr_ >> 0x20);
    P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
         P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
         - (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[2]
            * P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
              [3] + local_8c *
                    P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[0]);
    P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
         P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
         - (P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
            * K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
              [2] + (float)local_f0._4_4_ * local_8c);
    P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
         (float)uStack_60;
    P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
         (float)((ulong)uStack_60 >> 0x20);
    P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
         P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5]
         - (P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
            * K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
              [3] + (float)local_f0._4_4_ *
                    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                    array[0]);
    P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
         P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4]
         - (P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
            * K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
              [3] + (float)local_f0._0_4_ *
                    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                    array[0]);
    P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
         local_58 -
         (P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] *
          K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[3] +
         P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] *
         K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[0]);
    P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._16_8_ =
         pfVar9;
    P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._24_8_ =
         (CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)local_f0;
    unique0x10001037 = pfVar9;
    bVar2 = Kalman::SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_>::
            updateStateCovariance<Kalman::Vector<float,_2>_>
                      ((SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_> *)local_214,
                       (KalmanGain<Kalman::Vector<float,_2>_> *)pfVar9,
                       (CovarianceSquareRoot<Kalman::Vector<float,_2>_> *)
                       (Ssquared.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.
                        m_storage.m_data.array + 2));
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4]._0_1_ =
         bVar2;
    gtest_ar__1.success_ = false;
    gtest_ar__1._1_7_ = 0;
    if (bVar2) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar__1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
           );
    }
    else {
      testing::Message::Message((Message *)&local_48);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_f0,
                 (internal *)
                 (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                  array + 4),(AssertionResult *)"success","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
                 ,0xb1,(char *)local_f0);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (local_f0 !=
          (undefined1  [8])
          (P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2)
         ) {
        operator_delete((void *)local_f0);
      }
      if (local_48 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_48 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_48 + 8))();
        }
        local_48 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar__1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
           );
      if (!bVar2) {
        return;
      }
    }
    pfVar9 = (float *)local_f0;
    Eigen::LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::reconstructedMatrix
              ((MatrixType *)pfVar9,(LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)this_00);
    local_48 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
    local_38.data_ = (AssertHelperData *)0x3;
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)
               (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
               + 4),"P_ref.rows()","P.rows()",&local_48,(long *)&local_38);
    if (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4].
        _0_1_ == '\0') {
      testing::Message::Message((Message *)&local_48);
      if (gtest_ar__1._0_8_ == 0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)gtest_ar__1._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
                 ,0xb5,pcVar7);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (local_48 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_48 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_48 + 8))();
        }
        local_48 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar__1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
           );
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar__1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
           );
      local_48 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
      local_38.data_ = (AssertHelperData *)0x3;
      testing::internal::CmpHelperEQ<long,long>
                ((internal *)
                 (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                  array + 4),"P_ref.cols()","P.cols()",&local_48,(long *)&local_38);
      if (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4].
          _0_1_ == '\0') {
        testing::Message::Message((Message *)&local_48);
        if (gtest_ar__1._0_8_ == 0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)gtest_ar__1._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
                   ,0xb5,pcVar7);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if (local_48 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_48 !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_48 + 8))();
          }
          local_48 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar__1,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar__1,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        bVar2 = true;
        uVar6 = 0;
        do {
          lVar8 = 0;
          do {
            if (!bVar2) {
              __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<float, 3, 3>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<float, 3, 3>, Level = 1]"
                           );
            }
            testing::internal::DoubleNearPredFormat
                      ((internal *)
                       (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.
                        m_data.array + 4),"P_ref(i,j)","P(i,j)","1e-6",
                       (double)*(float *)((long)local_f8 + lVar8),
                       (double)*(float *)((long)pfVar9 + lVar8),1e-06);
            if (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
                [4]._0_1_ == '\0') {
              testing::Message::Message((Message *)&local_48);
              if (gtest_ar__1._0_8_ == 0) {
                pcVar7 = "";
              }
              else {
                pcVar7 = *(char **)gtest_ar__1._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_38,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
                         ,0xb5,pcVar7);
              testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
              testing::internal::AssertHelper::~AssertHelper(&local_38);
              if (local_48 !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar2 = testing::internal::IsTrue(true);
                if ((bVar2) &&
                   (local_48 !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)local_48 + 8))();
                }
                local_48 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                            *)0x0;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar__1,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              return;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar__1,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            lVar8 = lVar8 + 0xc;
          } while (lVar8 != 0x24);
          bVar2 = uVar6 < 2;
          uVar6 = uVar6 + 1;
          local_f8 = local_f8 + 1;
          pfVar9 = pfVar9 + 1;
        } while (uVar6 != 3);
      }
    }
  }
  else {
    testing::Message::Message
              ((Message *)
               (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
               + 4));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f0,(internal *)&fStack_b8,
               (AssertionResult *)"S_y.info() == Eigen::Success","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               (P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 8),kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
               ,0xa0,(char *)local_f0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               (P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 8),
               (Message *)
               (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
               + 4));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               (P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 8));
    if (local_f0 !=
        (undefined1  [8])
        (P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2))
    {
      operator_delete((void *)local_f0);
    }
    if (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array._16_8_
        != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array.
          _16_8_ != 0)) {
        (**(code **)(*(long *)K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                              m_storage.m_data.array._16_8_ + 8))();
      }
      K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] = 0.0;
      K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] = 0.0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&P_ref,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  return;
}

Assistant:

TEST(SquareRootUnscentedKalmanFilter, updateStateCovariance) {
    T alpha = 1, beta = 2, kappa = 1;
    
    auto ukf = SquareRootUnscentedKalmanFilter<Vector<T, 3>>(alpha,beta,kappa);
    
    // Setup S_y
    Matrix<T,2,2> Ssquared;
    Ssquared <<
        1, 0.1,
        0.1, 0.5;
    Cholesky<Matrix<T,2,2>> S_y;
    S_y.compute(0.1*Ssquared);
    ASSERT_TRUE(S_y.info() == Eigen::Success);
    
    // Setup Kalman Gain
    Matrix<T, 3, 2> K;
    K <<
        0.178408514951850, -0.304105423213381,
       -1.110998479472884,  0.802838317283324,
       -1.246156445345498,  0.063524243960128;
    
    // Setup S
    ukf.S.setIdentity();
    
    // Setup reference value for S (computed from regular UKF formula)
    Matrix<T,3,3> P_ref = ukf.S.reconstructedMatrix() - K * S_y.reconstructedMatrix() * K.transpose();

    // Perform update
    bool success = ukf.updateStateCovariance<Vector<T,2>>(K, S_y);
    ASSERT_TRUE(success);

    Matrix<T,3,3> P = ukf.S.reconstructedMatrix();
    
    ASSERT_MATRIX_NEAR(P_ref, P, 1e-6);
}